

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_beta_encode_int(cram_slice *slice,cram_codec *c,char *in,int in_size)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (in_size < 1) {
    uVar2 = 0;
  }
  else {
    uVar3 = 0;
    uVar2 = 0;
    do {
      uVar1 = store_bits_MSB(c->out,(c->field_6).huffman.ncodes + *(int *)(in + uVar3 * 4),
                             (c->field_6).beta.nbits);
      uVar2 = uVar2 | uVar1;
      uVar3 = uVar3 + 1;
    } while ((uint)in_size != uVar3);
  }
  return uVar2;
}

Assistant:

int cram_beta_encode_int(cram_slice *slice, cram_codec *c,
			 char *in, int in_size) {
    int *syms = (int *)in;
    int i, r = 0;

    for (i = 0; i < in_size; i++)
	r |= store_bits_MSB(c->out, syms[i] + c->e_beta.offset,
			    c->e_beta.nbits);

    return r;
}